

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ParenthesizedBinsSelectExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParenthesizedBinsSelectExprSyntax,slang::parsing::Token,slang::syntax::BinsSelectExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,BinsSelectExpressionSyntax *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  ParenthesizedBinsSelectExprSyntax *pPVar11;
  
  pPVar11 = (ParenthesizedBinsSelectExprSyntax *)allocate(this,0x40,8);
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_2->kind;
  uVar8 = args_2->field_0x2;
  NVar9.raw = (args_2->numFlags).raw;
  uVar10 = args_2->rawLen;
  pIVar2 = args_2->info;
  (pPVar11->super_BinsSelectExpressionSyntax).super_SyntaxNode.kind = ParenthesizedBinsSelectExpr;
  (pPVar11->super_BinsSelectExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pPVar11->super_BinsSelectExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pPVar11->openParen).kind = TVar3;
  (pPVar11->openParen).field_0x2 = uVar4;
  (pPVar11->openParen).numFlags = (NumericTokenFlags)NVar5.raw;
  (pPVar11->openParen).rawLen = uVar6;
  (pPVar11->openParen).info = pIVar1;
  (pPVar11->expr).ptr = args_1;
  (pPVar11->closeParen).kind = TVar7;
  (pPVar11->closeParen).field_0x2 = uVar8;
  (pPVar11->closeParen).numFlags = (NumericTokenFlags)NVar9.raw;
  (pPVar11->closeParen).rawLen = uVar10;
  (pPVar11->closeParen).info = pIVar2;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pPVar11;
  return pPVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }